

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O2

void __thiscall
FC_BPNN::predict(FC_BPNN *this,vector<double,_std::allocator<double>_> *data,
                vector<double,_std::allocator<double>_> *prediction)

{
  pointer pvVar1;
  
  clear(this);
  setSample(this,data);
  Forward(this);
  pvVar1 = (this->layers_value).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::operator=
            (prediction,
             pvVar1 + ((int)(((long)(this->layers_value).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) /
                            0x18) + -1));
  return;
}

Assistant:

void FC_BPNN::predict(const std::vector<double>& data, std::vector<double>& prediction)
{
	clear();
	setSample(data);
	Forward();
	int lastIndex = layers_value.size() - 1;
	prediction = layers_value[lastIndex];
}